

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O2

void add_object(state *s,uint32_t handle,uint32_t class)

{
  long lVar1;
  rnnenum *prVar2;
  rnnenum *prVar3;
  long lVar4;
  rnndeccontext *ctx;
  rnnvalue *prVar5;
  char *pcVar6;
  ulong uVar7;
  uint64_t uVar8;
  char *variant;
  ulong uVar9;
  ulong uVar10;
  uint64_t uVar11;
  
  prVar2 = rnn_findenum(s->db,"chipset");
  prVar3 = rnn_findenum(s->db,"obj-class");
  if ((prVar3 == (rnnenum *)0x0) || (prVar2 == (rnnenum *)0x0)) {
    fwrite("No obj-class/chipset enum found\n",0x20,1,_stderr);
    abort();
  }
  lVar1 = 0;
  do {
    lVar4 = lVar1;
    if (lVar4 + 0x18 == 0x1818) {
      fwrite("Too many objects\n",0x11,1,_stderr);
      return;
    }
    lVar1 = lVar4 + 0x18;
  } while (*(int *)((long)&s->objects[0].handle + lVar4) != 0);
  *(uint32_t *)((long)&s->objects[0].handle + lVar4) = handle;
  *(uint32_t *)((long)&s->objects[0].class + lVar4) = class;
  ctx = rnndec_newcontext(s->db);
  *(rnndeccontext **)((long)&s->objects[0].ctx + lVar4) = ctx;
  ctx->colors = s->colors;
  uVar9 = 0;
  uVar7 = (ulong)(uint)prVar2->valsnum;
  if (prVar2->valsnum < 1) {
    uVar7 = uVar9;
  }
  prVar5 = (rnnvalue *)0x0;
  do {
    if (uVar7 == uVar9) {
      uVar8 = prVar5->value;
      uVar11 = (uint64_t)s->chipset;
      break;
    }
    prVar5 = prVar2->vals[uVar9];
    uVar8 = prVar5->value;
    uVar11 = (uint64_t)s->chipset;
    uVar9 = uVar9 + 1;
  } while (uVar8 != uVar11);
  if (uVar8 == uVar11) {
    pcVar6 = prVar5->name;
  }
  else {
    pcVar6 = "NV1";
  }
  rnndec_varadd(ctx,"chipset",pcVar6);
  uVar9 = (ulong)class;
  uVar10 = 0;
  uVar7 = (ulong)(uint)prVar3->valsnum;
  if (prVar3->valsnum < 1) {
    uVar7 = uVar10;
  }
  prVar5 = (rnnvalue *)0x0;
  do {
    if (uVar7 == uVar10) {
      uVar8 = prVar5->value;
      break;
    }
    prVar5 = prVar3->vals[uVar10];
    uVar10 = uVar10 + 1;
    uVar8 = uVar9;
  } while (prVar5->value != uVar9);
  if (uVar8 == uVar9) {
    pcVar6 = prVar5->name;
    variant = pcVar6;
  }
  else {
    variant = "NV1_NULL";
    pcVar6 = (char *)0x0;
  }
  *(char **)((long)&s->objects[0].name + lVar4) = pcVar6;
  rnndec_varadd(*(rnndeccontext **)((long)&s->objects[0].ctx + lVar4),"obj-class",variant);
  return;
}

Assistant:

void
add_object(struct state *s, uint32_t handle, uint32_t class)
{
	struct rnnenum *chs = rnn_findenum(s->db, "chipset");
	struct rnnenum *cls = rnn_findenum(s->db, "obj-class");
	struct rnnvalue *v;
	struct obj *obj;
	int i;

	if (!cls || !chs) {
		fprintf(stderr, "No obj-class/chipset enum found\n");
		abort();
	}

	for (i = 0; obj = &s->objects[i], i < MAX_OBJECTS; i++) {
		if (!obj->handle) {
			obj->handle = handle;
			obj->class = class;
			obj->ctx = rnndec_newcontext(s->db);
			obj->ctx->colors = s->colors;

			v = NULL;
			FINDARRAY(chs->vals, v, v->value == s->chipset);
			rnndec_varadd(obj->ctx, "chipset",
				      v ? v->name : "NV1");

			v = NULL;
			FINDARRAY(cls->vals, v, v->value == class);
			obj->name = v ? v->name : NULL;
			rnndec_varadd(obj->ctx, "obj-class",
				      v ? v->name : "NV1_NULL");

			return;
		}
	}

	fprintf(stderr, "Too many objects\n");
}